

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

void __thiscall luna::Lexer::LexComment(Lexer *this)

{
  int iVar1;
  Lexer *in_RDI;
  
  iVar1 = Next(in_RDI);
  in_RDI->current_ = iVar1;
  if (in_RDI->current_ == 0x5b) {
    iVar1 = Next(in_RDI);
    in_RDI->current_ = iVar1;
    if (in_RDI->current_ == 0x5b) {
      LexMultiLineComment(this);
    }
    else {
      LexSingleLineComment(in_RDI);
    }
  }
  else {
    LexSingleLineComment(in_RDI);
  }
  return;
}

Assistant:

void Lexer::LexComment()
    {
        current_ = Next();
        if (current_ == '[')
        {
            current_ = Next();
            if (current_ == '[')
                LexMultiLineComment();
            else
                LexSingleLineComment();
        }
        else
            LexSingleLineComment();
    }